

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRotationZ.cpp
# Opt level: O0

void __thiscall
qclab::qgates::CRotationZ<std::complex<double>_>::apply
          (CRotationZ<std::complex<double>_> *this,Op op,int nbQubits,
          vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vector,int offset)

{
  int qubit1;
  undefined4 target_00;
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int controlState;
  reference pvVar5;
  complex<double> *pcVar6;
  complex<double> *vector_00;
  double __x;
  double __x_00;
  double sin;
  undefined1 local_80 [8];
  anon_class_40_3_96b6a9c1 f;
  int target;
  undefined1 local_40 [4];
  int control;
  vector<int,_std::allocator<int>_> qubits;
  int offset_local;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *vector_local;
  int nbQubits_local;
  Op op_local;
  CRotationZ<std::complex<double>_> *this_local;
  
  qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = offset;
  (*(this->super_QControlledGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
    super_QObject<std::complex<double>_>._vptr_QObject[5])();
  uVar1 = qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_40,0);
  uVar2 = qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_;
  *pvVar5 = *pvVar5 + uVar1;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_40,1);
  *pvVar5 = *pvVar5 + uVar2;
  iVar3 = QControlledGate2<std::complex<double>_>::control
                    (&this->super_QControlledGate2<std::complex<double>_>);
  iVar3 = iVar3 + qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_;
  iVar4 = (*(this->super_QControlledGate2<std::complex<double>_>).
            super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject
            [0xf])();
  vector_00 = (complex<double> *)
              (ulong)qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_;
  f.lambda2._M_value._8_4_ =
       iVar4 + qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage._4_4_;
  __x_00 = cos(this,__x);
  sin = CRotationZ<std::complex<double>_>::sin(this,__x_00);
  pcVar6 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::data(vector);
  lambda_RotationZ<std::complex<double>,double>
            ((anon_class_40_3_96b6a9c1 *)local_80,(qgates *)(ulong)(uint)(int)(char)op,(Op)pcVar6,
             __x_00,sin,vector_00);
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_40,0);
  iVar4 = *pvVar5;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_40,1);
  target_00 = f.lambda2._M_value._8_4_;
  qubit1 = *pvVar5;
  controlState = QControlledGate2<std::complex<double>_>::controlState
                           (&this->super_QControlledGate2<std::complex<double>_>);
  apply4<qclab::qgates::lambda_RotationZ<std::complex<double>,double>(qclab::Op,double,double,std::complex<double>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,iVar4,qubit1,iVar3,target_00,controlState,(anon_class_40_3_96b6a9c1 *)local_80
            );
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  return;
}

Assistant:

void CRotationZ< T >::apply( Op op , const int nbQubits ,
                               std::vector< T >& vector ,
                               const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    const int control = this->control() + offset ;
    const int target  = this->target()  + offset ;
    auto f = lambda_RotationZ( op , this->cos() , this->sin() , vector.data() );
    apply4( nbQubits , qubits[0] , qubits[1] , control , target ,
            this->controlState() , f ) ;
  }